

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  anon_union_8_4_dbbb708a_for_data aVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  __va_list_tag *p_Var8;
  bool bVar9;
  size_t sStack_1608;
  int len_1;
  size_t left;
  char *fptr;
  char formatbuf [32];
  char *point;
  void *ptr;
  size_t len;
  char *str;
  char *w;
  char *workend;
  longlong signed_num;
  unsigned_long_long num;
  long base;
  void *pvStack_1588;
  int is_neg;
  long prec;
  long width;
  int is_alt;
  va_stack_t *p;
  char work [256];
  char ***local_1460;
  char **end;
  char *endpos [128];
  va_stack_t vto [128];
  long param_num;
  long param;
  __va_list_tag *p_Stack_40;
  int done;
  char *f;
  char *digits;
  __va_list_tag *ap_save_local;
  char *format_local;
  _func_int_int_FILE_ptr *stream_local;
  void *data_local;
  
  f = "0123456789abcdefghijklmnopqrstuvwxyz";
  param._4_4_ = 0;
  vto[0x7f].data.str = (char *)0x0;
  digits = (char *)ap_save;
  ap_save_local = (__va_list_tag *)format;
  format_local = (char *)stream;
  stream_local = (_func_int_int_FILE_ptr *)data;
  dprintf_Pass1(format,(va_stack_t *)(endpos + 0x7f),(char **)&end,ap_save);
  p_Stack_40 = ap_save_local;
  local_1460 = &end;
  do {
    while( true ) {
      while( true ) {
        if ((char)p_Stack_40->gp_offset == '\0') {
          return param._4_4_;
        }
        if ((char)p_Stack_40->gp_offset == '%') break;
        do {
          iVar4 = (*(code *)format_local)((char)p_Stack_40->gp_offset,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
          p_Var8 = (__va_list_tag *)((long)&p_Stack_40->gp_offset + 1);
          bVar9 = false;
          if (*(char *)((long)&p_Stack_40->gp_offset + 1) != '\0') {
            bVar9 = (char)p_Var8->gp_offset != '%';
          }
          p_Stack_40 = p_Var8;
        } while (bVar9);
      }
      pcVar5 = (char *)((long)&p_Stack_40->gp_offset + 1);
      if (*pcVar5 != '%') break;
      p_Stack_40 = (__va_list_tag *)((long)&p_Stack_40->gp_offset + 2);
      iVar4 = (*(code *)format_local)(0x25,stream_local);
      if (iVar4 == -1) {
        return param._4_4_;
      }
      param._4_4_ = param._4_4_ + 1;
    }
    p_Stack_40 = (__va_list_tag *)pcVar5;
    lVar6 = dprintf_DollarString(pcVar5,(char **)&stack0xffffffffffffffc0);
    aVar2 = vto[0x7f].data;
    if (lVar6 == 0) {
      param_num = (long)vto[0x7f].data;
    }
    else {
      param_num = lVar6 + -1;
    }
    vto[0x7f].data.str = vto[0x7f].data.str + 1;
    if (((ulong)vto[param_num + -1].data.str & 0x400000000000) == 0) {
      prec._0_4_ = vto[param_num].type;
      prec._4_4_ = vto[param_num].flags;
    }
    else {
      prec = vto[*(long *)(vto + param_num)].precision;
    }
    if (((ulong)vto[param_num + -1].data.str & 0x1000000000000) == 0) {
      if (((ulong)vto[param_num + -1].data.str & 0x800000000000) == 0) {
        pvStack_1588 = (void *)0xffffffffffffffff;
      }
      else {
        pvStack_1588 = (void *)vto[param_num].width;
      }
    }
    else {
      pvStack_1588 = (void *)vto[vto[param_num].width].precision;
      vto[0x7f].data.str = aVar2.str + 2;
    }
    width._4_4_ = (*(uint *)((long)&vto[param_num + -1].data + 4) & 8) >> 3;
    switch(*(undefined4 *)&vto[param_num + -1].data) {
    case 1:
      len = vto[param_num].precision;
      if ((char *)len == (char *)0x0) {
        if ((pvStack_1588 == (void *)0xffffffffffffffff) || (4 < (long)pvStack_1588)) {
          len = (size_t)dprintf_formatf::null;
          ptr = (void *)0x5;
          *(uint *)((long)&vto[param_num + -1].data + 4) =
               *(uint *)((long)&vto[param_num + -1].data + 4) & 0xfffffff7;
        }
        else {
          len = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
          ptr = (void *)0x0;
        }
      }
      else if (pvStack_1588 == (void *)0xffffffffffffffff) {
        ptr = (void *)strlen((char *)len);
      }
      else {
        ptr = pvStack_1588;
      }
      prec = prec - (long)ptr;
      if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
        iVar4 = (*(code *)format_local)(0x22,stream_local);
        if (iVar4 == -1) {
          return param._4_4_;
        }
        param._4_4_ = param._4_4_ + 1;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
        while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
          iVar4 = (*(code *)format_local)(0x20,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
      }
      while( true ) {
        bVar9 = false;
        if (ptr != (void *)0x0) {
          bVar9 = *(char *)len != '\0';
        }
        if (!bVar9) break;
        iVar4 = (*(code *)format_local)(*(undefined1 *)len,stream_local);
        if (iVar4 == -1) {
          return param._4_4_;
        }
        param._4_4_ = param._4_4_ + 1;
        ptr = (void *)((long)ptr + -1);
        len = len + 1;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
        while (0 < prec) {
          iVar4 = (*(code *)format_local)(0x20,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
          prec = prec + -1;
        }
      }
      if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
        iVar4 = (*(code *)format_local)(0x22,stream_local);
        if (iVar4 == -1) {
          return param._4_4_;
        }
        param._4_4_ = param._4_4_ + 1;
      }
      break;
    case 2:
      signed_num = vto[param_num].precision;
      if (signed_num == 0) {
        prec = prec + -5;
        if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
          while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
            iVar4 = (*(code *)format_local)(0x20,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
          }
        }
        for (formatbuf._24_8_ = dprintf_formatf::strnil; *(char *)formatbuf._24_8_ != '\0';
            formatbuf._24_8_ = formatbuf._24_8_ + 1) {
          iVar4 = (*(code *)format_local)(*(undefined1 *)formatbuf._24_8_,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
        if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
          while (0 < prec) {
            iVar4 = (*(code *)format_local)(0x20,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
            prec = prec + -1;
          }
        }
      }
      else {
        num = 0x10;
        f = "0123456789abcdefghijklmnopqrstuvwxyz";
        if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
          f = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        }
        width._4_4_ = 1;
        bVar9 = false;
LAB_0090965e:
        pcVar5 = work + 0xf7;
        str = pcVar5;
        if (pvStack_1588 == (void *)0xffffffffffffffff) {
          pvStack_1588 = (void *)0x1;
        }
        for (; signed_num != 0; signed_num = (ulong)signed_num / num) {
          *str = f[(ulong)signed_num % num];
          str = str + -1;
        }
        prec = prec - ((long)pcVar5 - (long)str);
        pvStack_1588 = (void *)((long)pvStack_1588 - ((long)pcVar5 - (long)str));
        if (((width._4_4_ != 0) && (num == 8)) && ((long)pvStack_1588 < 1)) {
          *str = '0';
          prec = prec + -1;
          str = str + -1;
        }
        if (0 < (long)pvStack_1588) {
          prec = prec - (long)pvStack_1588;
          while (0 < (long)pvStack_1588) {
            *str = '0';
            str = str + -1;
            pvStack_1588 = (void *)((long)pvStack_1588 + -1);
          }
        }
        if ((width._4_4_ != 0) && (num == 0x10)) {
          prec = prec + -2;
        }
        if (((bVar9) || (((ulong)vto[param_num + -1].data.str & 0x200000000) != 0)) ||
           (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0)) {
          prec = prec + -1;
        }
        if ((((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) &&
           (((ulong)vto[param_num + -1].data.str & 0x10000000000) == 0)) {
          while (lVar6 = prec + -1, bVar1 = 0 < prec, prec = lVar6, bVar1) {
            iVar4 = (*(code *)format_local)(0x20,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
          }
        }
        if (bVar9) {
          iVar4 = (*(code *)format_local)(0x2d,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
        else if (((ulong)vto[param_num + -1].data.str & 0x200000000) == 0) {
          if (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0) {
            iVar4 = (*(code *)format_local)(0x20,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
          }
        }
        else {
          iVar4 = (*(code *)format_local)(0x2b,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
        if ((width._4_4_ != 0) && (num == 0x10)) {
          iVar4 = (*(code *)format_local)(0x30,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          if (((ulong)vto[param_num + -1].data.str & 0x100000000000) == 0) {
            iVar4 = (*(code *)format_local)(0x78,stream_local);
          }
          else {
            iVar4 = (*(code *)format_local)(0x58,stream_local);
          }
          if (iVar4 == -1) {
            return param._4_4_ + 1;
          }
          param._4_4_ = param._4_4_ + 2;
        }
        if ((((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) &&
           (((ulong)vto[param_num + -1].data.str & 0x10000000000) != 0)) {
          while (lVar6 = prec + -1, bVar9 = 0 < prec, prec = lVar6, bVar9) {
            iVar4 = (*(code *)format_local)(0x30,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
          }
        }
        while (str = str + 1, str <= pcVar5) {
          iVar4 = (*(code *)format_local)(*str,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
        if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
          while (0 < prec) {
            iVar4 = (*(code *)format_local)(0x20,stream_local);
            if (iVar4 == -1) {
              return param._4_4_;
            }
            param._4_4_ = param._4_4_ + 1;
            prec = prec + -1;
          }
        }
      }
      break;
    case 3:
      signed_num = vto[param_num].precision;
      if (((ulong)vto[param_num + -1].data.str & 0x2000000000000) == 0) {
        if (((ulong)vto[param_num + -1].data.str & 0x40000000000) == 0) {
          if (((ulong)vto[param_num + -1].data.str & 0x80000000000) == 0) {
            if (((ulong)vto[param_num + -1].data.str & 0x20000000000) == 0) {
              num = 10;
              bVar9 = vto[param_num].precision < 0;
              if (bVar9) {
                signed_num = 1 - (vto[param_num].precision + 1);
              }
              goto LAB_0090965e;
            }
            num = 10;
          }
          else {
            f = "0123456789abcdefghijklmnopqrstuvwxyz";
            if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
              f = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            }
            num = 0x10;
          }
        }
        else {
          num = 8;
        }
        bVar9 = false;
        goto LAB_0090965e;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x400000000) == 0) {
        while (prec = prec + -1, 0 < prec) {
          iVar4 = (*(code *)format_local)(0x20,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
      }
      iVar4 = (*(code *)format_local)(signed_num & 0xff,stream_local);
      if (iVar4 == -1) {
        return param._4_4_;
      }
      param._4_4_ = param._4_4_ + 1;
      if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
        while (prec = prec + -1, 0 < prec) {
          iVar4 = (*(code *)format_local)(0x20,stream_local);
          if (iVar4 == -1) {
            return param._4_4_;
          }
          param._4_4_ = param._4_4_ + 1;
        }
      }
      break;
    case 4:
      if (((ulong)vto[param_num + -1].data.str & 0x4000000000) == 0) {
        if (((ulong)vto[param_num + -1].data.str & 0x2000000000) == 0) {
          if (((ulong)vto[param_num + -1].data.str & 0x1000000000) == 0) {
            *(int *)vto[param_num].precision = param._4_4_;
          }
          else {
            *(short *)vto[param_num].precision = (short)param._4_4_;
          }
        }
        else {
          *(long *)vto[param_num].precision = (long)param._4_4_;
        }
      }
      else {
        *(long *)vto[param_num].precision = (long)param._4_4_;
      }
      break;
    default:
      break;
    case 7:
      fptr = (char *)0x25;
      formatbuf[0] = '\0';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      left = (long)&fptr + 1;
      sVar7 = strlen((char *)&fptr);
      sStack_1608 = 0x20 - sVar7;
      prec = -1;
      if (((ulong)vto[param_num + -1].data.str & 0x200000000000) == 0) {
        if (((ulong)vto[param_num + -1].data.str & 0x400000000000) != 0) {
          prec = vto[*(long *)(vto + param_num)].precision;
        }
      }
      else {
        prec._0_4_ = vto[param_num].type;
        prec._4_4_ = vto[param_num].flags;
      }
      pvStack_1588 = (void *)0xffffffffffffffff;
      if (((ulong)vto[param_num + -1].data.str & 0x800000000000) == 0) {
        if (((ulong)vto[param_num + -1].data.str & 0x1000000000000) != 0) {
          pvStack_1588 = (void *)vto[vto[param_num].width].precision;
        }
      }
      else {
        pvStack_1588 = (void *)vto[param_num].width;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x400000000) != 0) {
        left = (long)&fptr + 2;
        fptr._1_1_ = 0x2d;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x200000000) != 0) {
        *(undefined1 *)left = 0x2b;
        left = left + 1;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x100000000) != 0) {
        *(undefined1 *)left = 0x20;
        left = left + 1;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x800000000) != 0) {
        *(undefined1 *)left = 0x23;
        left = left + 1;
      }
      *(undefined1 *)left = 0;
      if (-1 < prec) {
        iVar4 = curl_msnprintf((char *)left,sStack_1608,"%ld",prec);
        left = left + (long)iVar4;
        sStack_1608 = sStack_1608 - (long)iVar4;
      }
      if (-1 < (long)pvStack_1588) {
        iVar4 = curl_msnprintf((char *)left,sStack_1608,".%ld",pvStack_1588);
        left = left + (long)iVar4;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x2000000000) != 0) {
        *(undefined1 *)left = 0x6c;
        left = left + 1;
      }
      if (((ulong)vto[param_num + -1].data.str & 0x4000000000000) == 0) {
        if (((ulong)vto[param_num + -1].data.str & 0x8000000000000) == 0) {
          *(undefined1 *)left = 0x66;
        }
        else {
          uVar3 = 0x67;
          if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
            uVar3 = 0x47;
          }
          *(undefined1 *)left = uVar3;
        }
      }
      else {
        uVar3 = 0x65;
        if (((ulong)vto[param_num + -1].data.str & 0x100000000000) != 0) {
          uVar3 = 0x45;
        }
        *(undefined1 *)left = uVar3;
      }
      left = left + 1;
      *(undefined1 *)left = 0;
      sprintf((char *)&p,(char *)&fptr,vto[param_num].precision);
      for (left = (size_t)&p; *(char *)left != '\0'; left = left + 1) {
        iVar4 = (*(code *)format_local)(*(undefined1 *)left,stream_local);
        if (iVar4 == -1) {
          return param._4_4_;
        }
        param._4_4_ = param._4_4_ + 1;
      }
    }
    p_Stack_40 = (__va_list_tag *)*local_1460;
    local_1460 = local_1460 + 1;
  } while( true );
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while((len-- > 0) && *str)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}